

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriterTests.cpp
# Opt level: O2

int testFileWriterTestsOffsetNotAligned(void)

{
  string *filePath;
  ostream *poVar1;
  pointer ptVar2;
  unsigned_long size;
  initializer_list<unsigned_char> __l;
  Span<const_unsigned_char,_18446744073709551615UL> data;
  allocator_type local_269;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  AutoDeleteTempFile tempfile;
  FileWriter writer;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&tempfile);
  writer.m_fileStream = (fstream)0xa;
  writer._1_3_ = 0x281e14;
  __l._M_len = 4;
  __l._M_array = (iterator)&writer;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&expected,__l,&local_269);
  filePath = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  MILBlob::Blob::FileWriter::FileWriter(&writer,filePath,true);
  ptVar2 = (pointer)0x0;
  if ((long)expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    ptVar2 = expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  data.m_size.m_size =
       (long)expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  data.m_ptr = ptVar2;
  MILBlob::Blob::FileWriter::WriteData(&writer,data,3);
  poVar1 = std::operator<<((ostream *)&std::clog,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x8b);
  std::operator<<(poVar1,": expected exception, but none thrown.\n");
  MILBlob::Blob::FileWriter::~FileWriter(&writer);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&tempfile);
  return 1;
}

Assistant:

int testFileWriterTestsOffsetNotAligned()
{
    AutoDeleteTempFile tempfile;
    // Writing to empty file
    {
        uint64_t offset = 3;
        std::vector<uint8_t> expected{10, 20, 30, 40};
        auto expectedSpan = Util::MakeSpan(expected);

        FileWriter writer(tempfile.GetFilename(), /* truncateFile */ true);
        ML_ASSERT_THROWS_WITH_MESSAGE(writer.WriteData(Util::SpanCast<uint8_t>(expectedSpan), offset),
                                      std::runtime_error,
                                      "Provided offset not aligned.");
    }

    return 0;
}